

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

ostream * mjs::operator<<(ostream *os,token_type t)

{
  ostream *poVar1;
  token_type t_local;
  ostream *os_local;
  
  switch(t) {
  case whitespace:
    os_local = std::operator<<(os,"whitespace");
    break;
  case line_terminator:
    os_local = std::operator<<(os,"line_terminator");
    break;
  case identifier:
    os_local = std::operator<<(os,"identifier");
    break;
  case numeric_literal:
    os_local = std::operator<<(os,"numeric_literal");
    break;
  case string_literal:
    os_local = std::operator<<(os,"string_literal");
    break;
  case rshiftshiftequal:
    os_local = std::operator<<(os,"rshiftshiftequal");
    break;
  case rshiftshift:
    os_local = std::operator<<(os,"rshiftshift");
    break;
  case lshiftequal:
    os_local = std::operator<<(os,"lshiftequal");
    break;
  case rshiftequal:
    os_local = std::operator<<(os,"rshiftequal");
    break;
  case equalequalequal:
    os_local = std::operator<<(os,"equalequalequal");
    break;
  case notequalequal:
    os_local = std::operator<<(os,"notequalequal");
    break;
  case equalequal:
    os_local = std::operator<<(os,"equalequal");
    break;
  case notequal:
    os_local = std::operator<<(os,"notequal");
    break;
  case ltequal:
    os_local = std::operator<<(os,"ltequal");
    break;
  case gtequal:
    os_local = std::operator<<(os,"gtequal");
    break;
  case andand:
    os_local = std::operator<<(os,"andand");
    break;
  case oror:
    os_local = std::operator<<(os,"oror");
    break;
  case plusplus:
    os_local = std::operator<<(os,"plusplus");
    break;
  case minusminus:
    os_local = std::operator<<(os,"minusminus");
    break;
  case lshift:
    os_local = std::operator<<(os,"lshift");
    break;
  case rshift:
    os_local = std::operator<<(os,"rshift");
    break;
  case plusequal:
    os_local = std::operator<<(os,"plusequal");
    break;
  case minusequal:
    os_local = std::operator<<(os,"minusequal");
    break;
  case multiplyequal:
    os_local = std::operator<<(os,"multiplyequal");
    break;
  case divideequal:
    os_local = std::operator<<(os,"divideequal");
    break;
  case andequal:
    os_local = std::operator<<(os,"andequal");
    break;
  case orequal:
    os_local = std::operator<<(os,"orequal");
    break;
  case xorequal:
    os_local = std::operator<<(os,"xorequal");
    break;
  case modequal:
    os_local = std::operator<<(os,"modequal");
    break;
  case equal:
    os_local = std::operator<<(os,"equal");
    break;
  case gt:
    os_local = std::operator<<(os,"gt");
    break;
  case lt:
    os_local = std::operator<<(os,"lt");
    break;
  case comma:
    os_local = std::operator<<(os,"comma");
    break;
  case not_:
    os_local = std::operator<<(os,"not_");
    break;
  case tilde:
    os_local = std::operator<<(os,"tilde");
    break;
  case question:
    os_local = std::operator<<(os,"question");
    break;
  case colon:
    os_local = std::operator<<(os,"colon");
    break;
  case dot:
    os_local = std::operator<<(os,"dot");
    break;
  case plus:
    os_local = std::operator<<(os,"plus");
    break;
  case minus:
    os_local = std::operator<<(os,"minus");
    break;
  case multiply:
    os_local = std::operator<<(os,"multiply");
    break;
  case divide:
    os_local = std::operator<<(os,"divide");
    break;
  case and_:
    os_local = std::operator<<(os,"and_");
    break;
  case or_:
    os_local = std::operator<<(os,"or_");
    break;
  case xor_:
    os_local = std::operator<<(os,"xor_");
    break;
  case mod:
    os_local = std::operator<<(os,"mod");
    break;
  case lparen:
    os_local = std::operator<<(os,"lparen");
    break;
  case rparen:
    os_local = std::operator<<(os,"rparen");
    break;
  case lbrace:
    os_local = std::operator<<(os,"lbrace");
    break;
  case rbrace:
    os_local = std::operator<<(os,"rbrace");
    break;
  case lbracket:
    os_local = std::operator<<(os,"lbracket");
    break;
  case rbracket:
    os_local = std::operator<<(os,"rbracket");
    break;
  case semicolon:
    os_local = std::operator<<(os,"semicolon");
    break;
  case abstract_:
    os_local = std::operator<<(os,"abstract");
    break;
  case boolean_:
    os_local = std::operator<<(os,"boolean");
    break;
  case break_:
    os_local = std::operator<<(os,"break");
    break;
  case byte_:
    os_local = std::operator<<(os,"byte");
    break;
  case case_:
    os_local = std::operator<<(os,"case");
    break;
  case catch_:
    os_local = std::operator<<(os,"catch");
    break;
  case char_:
    os_local = std::operator<<(os,"char");
    break;
  case class_:
    os_local = std::operator<<(os,"class");
    break;
  case const_:
    os_local = std::operator<<(os,"const");
    break;
  case continue_:
    os_local = std::operator<<(os,"continue");
    break;
  case debugger_:
    os_local = std::operator<<(os,"debugger");
    break;
  case default_:
    os_local = std::operator<<(os,"default");
    break;
  case delete_:
    os_local = std::operator<<(os,"delete");
    break;
  case do_:
    os_local = std::operator<<(os,"do");
    break;
  case double_:
    os_local = std::operator<<(os,"double");
    break;
  case else_:
    os_local = std::operator<<(os,"else");
    break;
  case enum_:
    os_local = std::operator<<(os,"enum");
    break;
  case export_:
    os_local = std::operator<<(os,"export");
    break;
  case extends_:
    os_local = std::operator<<(os,"extends");
    break;
  case false_:
    os_local = std::operator<<(os,"false");
    break;
  case final_:
    os_local = std::operator<<(os,"final");
    break;
  case finally_:
    os_local = std::operator<<(os,"finally");
    break;
  case float_:
    os_local = std::operator<<(os,"float");
    break;
  case for_:
    os_local = std::operator<<(os,"for");
    break;
  case function_:
    os_local = std::operator<<(os,"function");
    break;
  case goto_:
    os_local = std::operator<<(os,"goto");
    break;
  case if_:
    os_local = std::operator<<(os,"if");
    break;
  case implements_:
    os_local = std::operator<<(os,"implements");
    break;
  case import_:
    os_local = std::operator<<(os,"import");
    break;
  case in_:
    os_local = std::operator<<(os,"in");
    break;
  case instanceof_:
    os_local = std::operator<<(os,"instanceof");
    break;
  case int_:
    os_local = std::operator<<(os,"int");
    break;
  case interface_:
    os_local = std::operator<<(os,"interface");
    break;
  case let_:
    os_local = std::operator<<(os,"let");
    break;
  case long_:
    os_local = std::operator<<(os,"long");
    break;
  case native_:
    os_local = std::operator<<(os,"native");
    break;
  case new_:
    os_local = std::operator<<(os,"new");
    break;
  case null_:
    os_local = std::operator<<(os,"null");
    break;
  case package_:
    os_local = std::operator<<(os,"package");
    break;
  case private_:
    os_local = std::operator<<(os,"private");
    break;
  case protected_:
    os_local = std::operator<<(os,"protected");
    break;
  case public_:
    os_local = std::operator<<(os,"public");
    break;
  case return_:
    os_local = std::operator<<(os,"return");
    break;
  case short_:
    os_local = std::operator<<(os,"short");
    break;
  case static_:
    os_local = std::operator<<(os,"static");
    break;
  case super_:
    os_local = std::operator<<(os,"super");
    break;
  case switch_:
    os_local = std::operator<<(os,"switch");
    break;
  case synchronized_:
    os_local = std::operator<<(os,"synchronized");
    break;
  case this_:
    os_local = std::operator<<(os,"this");
    break;
  case throw_:
    os_local = std::operator<<(os,"throw");
    break;
  case throws_:
    os_local = std::operator<<(os,"throws");
    break;
  case transient_:
    os_local = std::operator<<(os,"transient");
    break;
  case true_:
    os_local = std::operator<<(os,"true");
    break;
  case try_:
    os_local = std::operator<<(os,"try");
    break;
  case typeof_:
    os_local = std::operator<<(os,"typeof");
    break;
  case var_:
    os_local = std::operator<<(os,"var");
    break;
  case void_:
    os_local = std::operator<<(os,"void");
    break;
  case volatile_:
    os_local = std::operator<<(os,"volatile");
    break;
  case while_:
    os_local = std::operator<<(os,"while");
    break;
  case with_:
    os_local = std::operator<<(os,"with");
    break;
  case yield_:
    os_local = std::operator<<(os,"yield");
    break;
  case eof:
    os_local = std::operator<<(os,"eof");
    break;
  default:
    poVar1 = std::operator<<(os,"token_type{");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t);
    os_local = std::operator<<(poVar1,"}");
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, token_type t) {
    switch (t) {
#define CASE_TOKEN_TYPE(n) case token_type::n: return os << #n;
        CASE_TOKEN_TYPE(whitespace)
        CASE_TOKEN_TYPE(line_terminator)
        CASE_TOKEN_TYPE(identifier)
        CASE_TOKEN_TYPE(numeric_literal)
        CASE_TOKEN_TYPE(string_literal)
        CASE_TOKEN_TYPE(eof)
#undef CASE_TOKEN_TYPE
#define CASE_PUNCTUATOR(n, ...) case token_type::n: return os << #n;
        MJS_PUNCTUATORS(CASE_PUNCTUATOR)
#undef CASE_PUNCTUATOR
#define CASE_KEYWORD(n, ...) case token_type::n ## _: return os << #n;
        MJS_KEYWORDS(CASE_KEYWORD)
#undef CASE_KEYWORD
    }
    return os << "token_type{" << (int)t << "}";
}